

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnnamedTypeName(State *state)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  State *in_RDI;
  int *unaff_retaddr;
  State *in_stack_00000008;
  int which;
  ParseState copy;
  ComplexityGuard guard;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar7;
  int iVar8;
  State *state_00;
  State *state_01;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    state_00 = *(State **)&local_10->parse_state;
    state_01 = *(State **)&(local_10->parse_state).prev_name_idx;
    iVar7 = -1;
    bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT44(0xffffffff,in_stack_ffffffffffffffc0));
    if (bVar1) {
      bVar1 = ParseNumber(in_stack_00000008,unaff_retaddr);
      bVar1 = Optional(bVar1);
      if (((bVar1) && (iVar8 = iVar7, iVar6 = std::numeric_limits<int>::max(), iVar7 <= iVar6 + -2))
         && (bVar1 = ParseOneCharToken(state_00,(char)((uint)iVar8 >> 0x18)), bVar1)) {
        MaybeAppend((State *)CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               CONCAT15(in_stack_ffffffffffffffa5,
                                                        CONCAT14(in_stack_ffffffffffffffa4,
                                                                 in_stack_ffffffffffffffa0)))),
                    (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        MaybeAppendDecimal(state_01,(int)((ulong)state_00 >> 0x20));
        MaybeAppend((State *)CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               CONCAT15(in_stack_ffffffffffffffa5,
                                                        CONCAT14(in_stack_ffffffffffffffa4,
                                                                 in_stack_ffffffffffffffa0)))),
                    (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        local_1 = 1;
        goto LAB_003d0a82;
      }
    }
    *(State **)&local_10->parse_state = state_00;
    *(State **)&(local_10->parse_state).prev_name_idx = state_01;
    iVar7 = -1;
    bVar1 = ParseTwoCharToken(state_00,(char *)CONCAT44(0xffffffff,in_stack_ffffffffffffffc0));
    if ((((bVar1) && (bVar1 = DisableAppend(local_10), bVar1)) &&
        ((bVar1 = ZeroOrMore((ParseFunc)
                             CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               CONCAT15(in_stack_ffffffffffffffa5,
                                                        CONCAT14(in_stack_ffffffffffffffa4,
                                                                 in_stack_ffffffffffffffa0)))),
                             (State *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
         , bVar1 &&
         ((bVar1 = OneOrMore((ParseFunc)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                             (State *)0x3d0950), bVar1 &&
          (bVar1 = RestoreAppend(local_10,(long)state_01 < 0), bVar1)))))) &&
       (uVar2 = ParseOneCharToken(state_00,(char)((uint)iVar7 >> 0x18)), (bool)uVar2)) {
      uVar3 = ParseNumber(in_stack_00000008,unaff_retaddr);
      uVar4 = Optional((bool)uVar3);
      if ((((bool)uVar4) &&
          (iVar8 = iVar7, iVar6 = std::numeric_limits<int>::max(), iVar7 <= iVar6 + -2)) &&
         (uVar5 = ParseOneCharToken(state_00,(char)((uint)iVar8 >> 0x18)), (bool)uVar5)) {
        MaybeAppend((State *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffffa4,iVar7)))),
                    (char *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
        MaybeAppendDecimal(state_01,(int)((ulong)state_00 >> 0x20));
        MaybeAppend((State *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffffa4,iVar7)))),
                    (char *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
        local_1 = 1;
        goto LAB_003d0a82;
      }
    }
    *(State **)&local_10->parse_state = state_00;
    *(State **)&(local_10->parse_state).prev_name_idx = state_01;
    local_1 = 0;
  }
LAB_003d0a82:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseUnnamedTypeName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  // Type's 1-based index n is encoded as { "", n == 1; itoa(n-2), otherwise }.
  // Optionally parse the encoded value into 'which' and add 2 to get the index.
  int which = -1;

  // Unnamed type local to function or class.
  if (ParseTwoCharToken(state, "Ut") && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{unnamed type#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  // Closure type.
  which = -1;
  if (ParseTwoCharToken(state, "Ul") && DisableAppend(state) &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      OneOrMore(ParseType, state) && RestoreAppend(state, copy.append) &&
      ParseOneCharToken(state, 'E') && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{lambda()#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  return false;
}